

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctfst.c
# Opt level: O0

void jpeg_fdct_ifast(DCTELEM *data)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  int ctr;
  DCTELEM *dataptr;
  DCTELEM z13;
  DCTELEM z11;
  DCTELEM z5;
  DCTELEM z4;
  DCTELEM z3;
  DCTELEM z2;
  DCTELEM z1;
  DCTELEM tmp13;
  DCTELEM tmp12;
  DCTELEM tmp11;
  DCTELEM tmp10;
  DCTELEM tmp7;
  DCTELEM tmp6;
  DCTELEM tmp5;
  DCTELEM tmp4;
  DCTELEM tmp3;
  DCTELEM tmp2;
  DCTELEM tmp1;
  DCTELEM tmp0;
  DCTELEM *data_local;
  
  dataptr = data;
  for (ctr = 7; -1 < ctr; ctr = ctr + -1) {
    sVar1 = *dataptr - dataptr[7];
    sVar6 = dataptr[6];
    sVar7 = dataptr[2];
    sVar5 = dataptr[4];
    sVar2 = *dataptr + dataptr[7] + dataptr[3] + dataptr[4];
    sVar3 = (*dataptr + dataptr[7]) - (dataptr[3] + dataptr[4]);
    sVar4 = dataptr[1] + dataptr[6] + dataptr[2] + dataptr[5];
    *dataptr = sVar2 + sVar4;
    dataptr[4] = sVar2 - sVar4;
    sVar2 = (short)((ulong)((long)((int)(short)((dataptr[1] + dataptr[6]) -
                                               (dataptr[2] + dataptr[5])) + (int)sVar3) * 0xb5) >> 8
                   );
    dataptr[2] = sVar3 + sVar2;
    dataptr[6] = sVar3 - sVar2;
    sVar5 = (dataptr[3] - sVar5) + (sVar7 - dataptr[5]);
    sVar2 = (dataptr[1] - sVar6) + sVar1;
    sVar3 = (short)((ulong)((long)((int)sVar5 - (int)sVar2) * 0x62) >> 8);
    sVar5 = (short)((ulong)((long)sVar5 * 0x8b) >> 8) + sVar3;
    sVar3 = (short)((ulong)((long)sVar2 * 0x14e) >> 8) + sVar3;
    sVar6 = (short)((ulong)((long)(short)((sVar7 - dataptr[5]) + (dataptr[1] - sVar6)) * 0xb5) >> 8)
    ;
    sVar7 = sVar1 + sVar6;
    sVar1 = sVar1 - sVar6;
    dataptr[5] = sVar1 + sVar5;
    dataptr[3] = sVar1 - sVar5;
    dataptr[1] = sVar7 + sVar3;
    dataptr[7] = sVar7 - sVar3;
    dataptr = dataptr + 8;
  }
  dataptr = data;
  for (ctr = 7; -1 < ctr; ctr = ctr + -1) {
    sVar1 = *dataptr - dataptr[0x38];
    sVar6 = dataptr[0x30];
    sVar7 = dataptr[0x10];
    sVar5 = dataptr[0x20];
    sVar2 = *dataptr + dataptr[0x38] + dataptr[0x18] + dataptr[0x20];
    sVar3 = (*dataptr + dataptr[0x38]) - (dataptr[0x18] + dataptr[0x20]);
    sVar4 = dataptr[8] + dataptr[0x30] + dataptr[0x10] + dataptr[0x28];
    *dataptr = sVar2 + sVar4;
    dataptr[0x20] = sVar2 - sVar4;
    sVar2 = (short)((ulong)((long)((int)(short)((dataptr[8] + dataptr[0x30]) -
                                               (dataptr[0x10] + dataptr[0x28])) + (int)sVar3) * 0xb5
                           ) >> 8);
    dataptr[0x10] = sVar3 + sVar2;
    dataptr[0x30] = sVar3 - sVar2;
    sVar5 = (dataptr[0x18] - sVar5) + (sVar7 - dataptr[0x28]);
    sVar2 = (dataptr[8] - sVar6) + sVar1;
    sVar3 = (short)((ulong)((long)((int)sVar5 - (int)sVar2) * 0x62) >> 8);
    sVar5 = (short)((ulong)((long)sVar5 * 0x8b) >> 8) + sVar3;
    sVar3 = (short)((ulong)((long)sVar2 * 0x14e) >> 8) + sVar3;
    sVar6 = (short)((ulong)((long)(short)((sVar7 - dataptr[0x28]) + (dataptr[8] - sVar6)) * 0xb5) >>
                   8);
    sVar7 = sVar1 + sVar6;
    sVar1 = sVar1 - sVar6;
    dataptr[0x28] = sVar1 + sVar5;
    dataptr[0x18] = sVar1 - sVar5;
    dataptr[8] = sVar7 + sVar3;
    dataptr[0x38] = sVar7 - sVar3;
    dataptr = dataptr + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_ifast(DCTELEM *data)
{
  DCTELEM tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  DCTELEM tmp10, tmp11, tmp12, tmp13;
  DCTELEM z1, z2, z3, z4, z5, z11, z13;
  DCTELEM *dataptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[0] + dataptr[7];
    tmp7 = dataptr[0] - dataptr[7];
    tmp1 = dataptr[1] + dataptr[6];
    tmp6 = dataptr[1] - dataptr[6];
    tmp2 = dataptr[2] + dataptr[5];
    tmp5 = dataptr[2] - dataptr[5];
    tmp3 = dataptr[3] + dataptr[4];
    tmp4 = dataptr[3] - dataptr[4];

    /* Even part */

    tmp10 = tmp0 + tmp3;        /* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[0] = tmp10 + tmp11; /* phase 3 */
    dataptr[4] = tmp10 - tmp11;

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_707106781); /* c4 */
    dataptr[2] = tmp13 + z1;    /* phase 5 */
    dataptr[6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;        /* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = MULTIPLY(tmp10 - tmp12, FIX_0_382683433); /* c6 */
    z2 = MULTIPLY(tmp10, FIX_0_541196100) + z5; /* c2-c6 */
    z4 = MULTIPLY(tmp12, FIX_1_306562965) + z5; /* c2+c6 */
    z3 = MULTIPLY(tmp11, FIX_0_707106781); /* c4 */

    z11 = tmp7 + z3;            /* phase 5 */
    z13 = tmp7 - z3;

    dataptr[5] = z13 + z2;      /* phase 6 */
    dataptr[3] = z13 - z2;
    dataptr[1] = z11 + z4;
    dataptr[7] = z11 - z4;

    dataptr += DCTSIZE;         /* advance pointer to next row */
  }

  /* Pass 2: process columns. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE * 0] + dataptr[DCTSIZE * 7];
    tmp7 = dataptr[DCTSIZE * 0] - dataptr[DCTSIZE * 7];
    tmp1 = dataptr[DCTSIZE * 1] + dataptr[DCTSIZE * 6];
    tmp6 = dataptr[DCTSIZE * 1] - dataptr[DCTSIZE * 6];
    tmp2 = dataptr[DCTSIZE * 2] + dataptr[DCTSIZE * 5];
    tmp5 = dataptr[DCTSIZE * 2] - dataptr[DCTSIZE * 5];
    tmp3 = dataptr[DCTSIZE * 3] + dataptr[DCTSIZE * 4];
    tmp4 = dataptr[DCTSIZE * 3] - dataptr[DCTSIZE * 4];

    /* Even part */

    tmp10 = tmp0 + tmp3;        /* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE * 0] = tmp10 + tmp11; /* phase 3 */
    dataptr[DCTSIZE * 4] = tmp10 - tmp11;

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_707106781); /* c4 */
    dataptr[DCTSIZE * 2] = tmp13 + z1; /* phase 5 */
    dataptr[DCTSIZE * 6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;        /* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = MULTIPLY(tmp10 - tmp12, FIX_0_382683433); /* c6 */
    z2 = MULTIPLY(tmp10, FIX_0_541196100) + z5; /* c2-c6 */
    z4 = MULTIPLY(tmp12, FIX_1_306562965) + z5; /* c2+c6 */
    z3 = MULTIPLY(tmp11, FIX_0_707106781); /* c4 */

    z11 = tmp7 + z3;            /* phase 5 */
    z13 = tmp7 - z3;

    dataptr[DCTSIZE * 5] = z13 + z2; /* phase 6 */
    dataptr[DCTSIZE * 3] = z13 - z2;
    dataptr[DCTSIZE * 1] = z11 + z4;
    dataptr[DCTSIZE * 7] = z11 - z4;

    dataptr++;                  /* advance pointer to next column */
  }
}